

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

void __thiscall QToolBar::setMovable(QToolBar *this,bool movable)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 local_29;
  void *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((bool)*(char *)(lVar1 + 0x256) == !movable) {
    *(bool *)(lVar1 + 0x256) = movable;
    (**(code **)(**(long **)(lVar1 + 0x278) + 0x70))();
    local_29 = *(undefined1 *)(lVar1 + 0x256);
    puStack_20 = &local_29;
    local_28 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::setMovable(bool movable)
{
    Q_D(QToolBar);
    if (!movable == !d->movable)
        return;
    d->movable = movable;
    d->layout->invalidate();
    emit movableChanged(d->movable);
}